

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_image_color_tint_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_color color,void *dst,rf_int dst_size)

{
  void *src;
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [15];
  undefined1 auVar9 [14];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [14];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [13];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined8 uVar19;
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [14];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  uint6 uVar26;
  int iVar27;
  rf_color rVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  short sVar34;
  int iVar35;
  int iVar40;
  int iVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar42;
  undefined4 local_8c;
  undefined1 local_88 [16];
  void *local_70;
  rf_image *local_68;
  long local_60;
  ulong local_58;
  void *local_50;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar36;
  undefined6 uVar37;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  if (image.valid == true) {
    iVar27 = rf_pixel_buffer_size(image.width,image.height,image.format);
    if (iVar27 <= dst_size) {
      local_88 = ZEXT416((uint)color);
      local_70 = dst;
      local_68 = __return_storage_ptr__;
      iVar27 = rf_bytes_per_pixel(image.format);
      auVar8[0xd] = 0;
      auVar8._0_13_ = local_88._0_13_;
      auVar8[0xe] = local_88[7];
      auVar10[0xc] = local_88[6];
      auVar10._0_12_ = local_88._0_12_;
      auVar10._13_2_ = auVar8._13_2_;
      auVar11[0xb] = 0;
      auVar11._0_11_ = local_88._0_11_;
      auVar11._12_3_ = auVar10._12_3_;
      auVar12[10] = local_88[5];
      auVar12._0_10_ = local_88._0_10_;
      auVar12._11_4_ = auVar11._11_4_;
      auVar14[9] = 0;
      auVar14._0_9_ = local_88._0_9_;
      auVar14._10_5_ = auVar12._10_5_;
      auVar15[8] = local_88[4];
      auVar15._0_8_ = local_88._0_8_;
      auVar15._9_6_ = auVar14._9_6_;
      auVar20._7_8_ = 0;
      auVar20._0_7_ = auVar15._8_7_;
      Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),local_88[3]);
      auVar24._9_6_ = 0;
      auVar24._0_9_ = Var21;
      auVar22._1_10_ = SUB1510(auVar24 << 0x30,5);
      auVar22[0] = local_88[2];
      auVar25._11_4_ = 0;
      auVar25._0_11_ = auVar22;
      auVar17[2] = local_88[1];
      auVar17._0_2_ = local_88._0_2_;
      auVar17._3_12_ = SUB1512(auVar25 << 0x20,3);
      auVar18._2_13_ = auVar17._2_13_;
      auVar18._0_2_ = local_88._0_2_ & 0xff;
      auVar9._10_2_ = 0;
      auVar9._0_10_ = auVar18._0_10_;
      auVar9._12_2_ = (short)Var21;
      uVar26 = CONCAT42(auVar9._10_4_,auVar22._0_2_);
      auVar23._6_8_ = 0;
      auVar23._0_6_ = uVar26;
      auVar13._4_2_ = auVar17._2_2_;
      auVar13._0_4_ = auVar18._0_4_;
      auVar13._6_8_ = SUB148(auVar23 << 0x40,6);
      auVar39._0_4_ = (float)(auVar18._0_4_ & 0xffff);
      auVar39._4_4_ = (float)auVar13._4_4_;
      auVar39._8_4_ = (float)(int)uVar26;
      auVar39._12_4_ = (float)(auVar9._10_4_ >> 0x10);
      _local_48 = divps(auVar39,_DAT_0016fb80);
      local_50 = image.data;
      local_60 = (long)image.width;
      if ((long)image.width < 1) {
        local_60 = 0;
      }
      uVar32 = 0;
      uVar31 = (ulong)(uint)image.height;
      if (image.height < 1) {
        uVar31 = uVar32;
      }
      local_88._0_4_ = iVar27;
      uVar29 = 0;
      while( true ) {
        lVar30 = local_60;
        local_58 = uVar32;
        if (uVar29 == uVar31) break;
        while (bVar33 = lVar30 != 0, lVar30 = lVar30 + -1, bVar33) {
          src = (void *)((long)local_50 + (long)(int)uVar32);
          rVar28 = rf_format_one_pixel_to_rgba32(src,image.format);
          auVar16[0xc] = rVar28.a;
          auVar16._0_12_ = ZEXT712(0);
          auVar38._0_4_ = (float)((uint)rVar28 & 0xff);
          auVar38._4_4_ = (float)((uint)rVar28 >> 8 & 0xff);
          auVar38._8_4_ = (float)(int)CONCAT32(auVar16._10_3_,(ushort)rVar28.b);
          auVar38._12_4_ = (float)(uint3)(auVar16._10_3_ >> 0x10);
          auVar39 = divps(auVar38,_DAT_0016fb80);
          iVar35 = (int)(auVar39._0_4_ * (float)local_48._0_4_ * (float)DAT_0016fb80);
          iVar40 = (int)(auVar39._4_4_ * (float)local_48._4_4_ * DAT_0016fb80._4_4_);
          iVar41 = (int)(auVar39._8_4_ * fStack_40 * DAT_0016fb80._8_4_);
          iVar42 = (int)(auVar39._12_4_ * fStack_3c * DAT_0016fb80._12_4_);
          sVar5 = (short)iVar35;
          cVar1 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar35 - (0xff < sVar5);
          sVar5 = (short)((uint)iVar35 >> 0x10);
          sVar34 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar35 >> 0x10) -
                            (0xff < sVar5),cVar1);
          sVar5 = (short)iVar40;
          cVar2 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar40 - (0xff < sVar5);
          sVar5 = (short)((uint)iVar40 >> 0x10);
          uVar36 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar40 >> 0x10) -
                            (0xff < sVar5),CONCAT12(cVar2,sVar34));
          sVar5 = (short)iVar41;
          cVar3 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar41 - (0xff < sVar5);
          sVar5 = (short)((uint)iVar41 >> 0x10);
          uVar37 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar41 >> 0x10) -
                            (0xff < sVar5),CONCAT14(cVar3,uVar36));
          sVar5 = (short)iVar42;
          cVar4 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar42 - (0xff < sVar5);
          sVar7 = (short)((uint)iVar42 >> 0x10);
          sVar5 = (short)((uint)uVar36 >> 0x10);
          sVar6 = (short)((uint6)uVar37 >> 0x20);
          sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * (char)((uint)iVar42 >> 0x10) -
                                   (0xff < sVar7),CONCAT16(cVar4,uVar37)) >> 0x30);
          local_8c = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                              CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                       CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 -
                                                (0xff < sVar5),
                                                (0 < sVar34) * (sVar34 < 0x100) * cVar1 -
                                                (0xff < sVar34))));
          rf_format_one_pixel(&local_8c,RF_UNCOMPRESSED_R8G8B8A8,src,image.format);
          uVar32 = (ulong)(uint)((int)uVar32 + local_88._0_4_);
        }
        uVar29 = uVar29 + 1;
        uVar32 = (ulong)(uint)((int)local_58 + image.width * iVar27);
      }
      local_68->data = image.data;
      local_68->width = (int)image._8_8_;
      local_68->height = (int)((ulong)image._8_8_ >> 0x20);
      uVar19 = image._16_8_;
      local_68->format = (int)uVar19;
      local_68->valid = (_Bool)(char)((ulong)uVar19 >> 0x20);
      *(int3 *)&local_68->field_0x15 = (int3)((ulong)uVar19 >> 0x28);
      local_68->data = local_70;
      __return_storage_ptr__ = local_68;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_color_tint_to_buffer(rf_image image, rf_color color, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            int bpp = rf_bytes_per_pixel(image.format);

            float c_r = ((float) color.r) / 255.0f;
            float c_g = ((float) color.g) / 255.0f;
            float c_b = ((float) color.b) / 255.0f;
            float c_a = ((float) color.a) / 255.0f;

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    int   index = y * image.width + x;
                    void* src_pixel = ((unsigned char*)image.data) + index * bpp;
                    void* dst_pixel = ((unsigned char*)image.data) + index * bpp;

                    rf_color pixel_rgba32 = rf_format_one_pixel_to_rgba32(src_pixel, image.format);

                    pixel_rgba32.r = (unsigned char) (255.f * (((float)pixel_rgba32.r) / 255.f * c_r));
                    pixel_rgba32.g = (unsigned char) (255.f * (((float)pixel_rgba32.g) / 255.f * c_g));
                    pixel_rgba32.b = (unsigned char) (255.f * (((float)pixel_rgba32.b) / 255.f * c_b));
                    pixel_rgba32.a = (unsigned char) (255.f * (((float)pixel_rgba32.a) / 255.f * c_a));

                    rf_format_one_pixel(&pixel_rgba32, RF_UNCOMPRESSED_R8G8B8A8, dst_pixel, image.format);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}